

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdBot.cpp
# Opt level: O0

Index * getIndex(string *threadId)

{
  Index *pIVar1;
  Index newIndex;
  type *commentList;
  type *thread;
  Index *index;
  pair<Thread,_std::vector<Comment,_std::allocator<Comment>_>_> *this;
  function<bool_(const_Index_&)> *in_stack_fffffffffffffe30;
  Index *in_stack_fffffffffffffe38;
  Index *in_stack_fffffffffffffe40;
  function<bool_(const_Index_&)> *in_stack_fffffffffffffe50;
  Cache<Index> *in_stack_fffffffffffffe58;
  Index *in_stack_fffffffffffffec8;
  Cache<Index> *in_stack_fffffffffffffed0;
  undefined8 in_stack_ffffffffffffff50;
  Reddit *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  Index *in_stack_ffffffffffffff78;
  anon_class_8_1_3fc1e243 local_30 [4];
  Index *local_10;
  
  std::function<bool(Index_const&)>::function<getIndex(std::__cxx11::string_const&)::__0,void>
            (in_stack_fffffffffffffe30,local_30);
  pIVar1 = Cache<Index>::find(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  std::function<bool_(const_Index_&)>::~function((function<bool_(const_Index_&)> *)0x1137be);
  local_10 = pIVar1;
  if (pIVar1 == (Index *)0x0) {
    this = (pair<Thread,_std::vector<Comment,_std::allocator<Comment>_>_> *)&stack0xffffffffffffff18
    ;
    Reddit::requestThread(in_stack_ffffffffffffff58,(string *)in_stack_ffffffffffffff50);
    std::get<0ul,Thread,std::vector<Comment,std::allocator<Comment>>>
              ((pair<Thread,_std::vector<Comment,_std::allocator<Comment>_>_> *)0x113815);
    std::get<1ul,Thread,std::vector<Comment,std::allocator<Comment>>>
              ((pair<Thread,_std::vector<Comment,_std::allocator<Comment>_>_> *)0x11382a);
    Index::Index(in_stack_ffffffffffffff78,(Thread *)in_stack_ffffffffffffff70,
                 (vector<Comment,_std::allocator<Comment>_> *)in_stack_ffffffffffffff68);
    Index::Index(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    local_10 = Cache<Index>::add(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    Index::~Index((Index *)this);
    Index::~Index((Index *)this);
    std::pair<Thread,_std::vector<Comment,_std::allocator<Comment>_>_>::~pair(this);
  }
  return local_10;
}

Assistant:

Index* getIndex(const std::string& threadId) {
    Index* index = threadCache.find([&](const Index& i) {
        return i.getThreadId() == threadId;
    });

    if (index == nullptr) {
        const auto& [thread, commentList] = reddit->requestThread(threadId);
        Index newIndex(thread, commentList);
        index = threadCache.add(newIndex);
    }

    return index;
}